

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsumst.hpp
# Opt level: O3

void __thiscall
soplex::SPxSumST<double>::setupWeights(SPxSumST<double> *this,SPxSolverBase<double> *base)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  Item *pIVar5;
  DataKey *pDVar6;
  Nonzero<double> *pNVar7;
  bool bVar8;
  double *pdVar9;
  pointer __s;
  pointer pdVar10;
  SPxVectorST<double> *this_00;
  long lVar11;
  ulong uVar12;
  Nonzero<double> *pNVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  VectorBase<double> delta;
  VectorBase<double> work;
  VectorBase<double> rowLen;
  iterator __end0;
  int dimen;
  VectorBase<double> local_d8;
  VectorBase<double> local_b8;
  pointer local_a0;
  VectorBase<double> local_98;
  SPxSolverBase<double> *local_78;
  SPxVectorST<double> *local_70;
  size_t local_68;
  long local_60;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  pointer local_40;
  ulong local_38;
  
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  VectorBase<double>::reDim
            (&local_98,
             (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  VectorBase<double>::reDim
            (&local_b8,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  VectorBase<double>::reDim
            (&local_d8,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  pdVar10 = local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  __s = local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar3 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_a0 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_40 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  pdVar4 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar1 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  if (0 < (int)uVar1) {
    pIVar5 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             theitem;
    pDVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thekey;
    uVar12 = (ulong)uVar1;
    do {
      uVar16 = uVar12 - 1;
      iVar2 = pDVar6[uVar12 - 1].idx;
      uVar19 = pIVar5[iVar2].data.super_SVectorBase<double>.memused;
      uVar14 = (ulong)uVar19;
      if (uVar14 == 0) {
        local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16] = 0.0;
      }
      else {
        pNVar7 = pIVar5[iVar2].data.super_SVectorBase<double>.m_elem;
        dVar21 = 0.0;
        pNVar13 = pNVar7;
        uVar17 = uVar19;
        do {
          pdVar9 = &pNVar13->val;
          pNVar13 = pNVar13 + 1;
          dVar21 = dVar21 + *pdVar9 * *pdVar9;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
        local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16] = dVar21;
        dVar22 = pdVar3[uVar16];
        if (dVar22 <= 0.0) {
          dVar22 = local_a0[uVar16];
          if ((dVar22 < 0.0) && (0 < (int)uVar19)) {
            uVar18 = uVar14 + 1;
            piVar15 = &pNVar7[uVar14 - 1].idx;
            do {
              local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar15] =
                   ((Nonzero<double> *)(piVar15 + -2))->val * (dVar22 / dVar21) +
                   local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[*piVar15];
              uVar18 = uVar18 - 1;
              piVar15 = piVar15 + -4;
            } while (1 < uVar18);
          }
        }
        else if (0 < (int)uVar19) {
          uVar18 = uVar14 + 1;
          piVar15 = &pNVar7[uVar14 - 1].idx;
          do {
            local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar15] =
                 ((Nonzero<double> *)(piVar15 + -2))->val * (dVar22 / dVar21) +
                 local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar15];
            uVar18 = uVar18 - 1;
            piVar15 = piVar15 + -4;
          } while (1 < uVar18);
        }
      }
      bVar8 = 1 < (long)uVar12;
      uVar12 = uVar16;
    } while (bVar8);
  }
  local_48 = (ulong)((long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
  local_50 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set.thenum;
  uVar19 = (uint)local_48;
  local_58 = local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_68 = (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start & 0xfffffffffffffff8;
  pIVar5 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           theitem;
  pDVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           thekey;
  local_60 = local_50 + 1;
  uVar12 = 0;
  local_78 = base;
  local_70 = &this->super_SPxVectorST<double>;
  while( true ) {
    this_00 = local_70;
    if (0 < (int)local_48) {
      uVar16 = 0;
      do {
        pdVar10[uVar16] = __s[uVar16] + pdVar10[uVar16];
        uVar16 = uVar16 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar16);
    }
    lVar11 = local_60;
    if (0 < (int)local_50) {
      do {
        dVar21 = local_40[lVar11 + -2];
        dVar22 = pdVar10[lVar11 + -2];
        if (dVar21 < pdVar10[lVar11 + -2]) {
          pdVar10[lVar11 + -2] = dVar21;
          dVar22 = dVar21;
        }
        dVar21 = pdVar4[lVar11 + -2];
        if (dVar22 < dVar21) {
          pdVar10[lVar11 + -2] = dVar21;
        }
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
    if ((int)uVar12 == 0xc) break;
    local_38 = uVar12;
    if (__s != local_58) {
      memset(__s,0,local_68);
    }
    uVar12 = (ulong)uVar1;
    if (0 < (int)uVar1) {
      do {
        uVar16 = uVar12 - 1;
        iVar2 = pDVar6[uVar12 - 1].idx;
        uVar17 = pIVar5[iVar2].data.super_SVectorBase<double>.memused;
        uVar14 = (ulong)uVar17;
        if (0 < (int)uVar17) {
          pNVar7 = pIVar5[iVar2].data.super_SVectorBase<double>.m_elem;
          uVar17 = uVar17 + 1;
          dVar22 = 0.0;
          pNVar13 = pNVar7;
          dVar21 = 0.0;
          do {
            dVar23 = pNVar13->val * pdVar10[pNVar13->idx];
            dVar20 = dVar21 + dVar23;
            dVar22 = dVar22 + (dVar23 - (dVar20 - dVar21)) + (dVar21 - (dVar20 - (dVar20 - dVar21)))
            ;
            pNVar13 = pNVar13 + 1;
            uVar17 = uVar17 - 1;
            dVar21 = dVar20;
          } while (1 < uVar17);
          dVar20 = dVar20 + dVar22;
          dVar21 = pdVar3[uVar16];
          if (dVar21 <= dVar20) {
            dVar21 = local_a0[uVar16];
            if (dVar21 < dVar20) {
              dVar22 = local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
              uVar18 = uVar14 + 1;
              piVar15 = &pNVar7[uVar14 - 1].idx;
              do {
                __s[*piVar15] =
                     ((Nonzero<double> *)(piVar15 + -2))->val * ((dVar21 - dVar20) / dVar22) +
                     __s[*piVar15];
                uVar18 = uVar18 - 1;
                piVar15 = piVar15 + -4;
              } while (1 < uVar18);
            }
          }
          else {
            dVar22 = local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
            uVar18 = uVar14 + 1;
            piVar15 = &pNVar7[uVar14 - 1].idx;
            do {
              __s[*piVar15] =
                   ((Nonzero<double> *)(piVar15 + -2))->val * ((dVar21 - dVar20) / dVar22) +
                   __s[*piVar15];
              uVar18 = uVar18 - 1;
              piVar15 = piVar15 + -4;
            } while (1 < uVar18);
          }
        }
        bVar8 = 1 < (long)uVar12;
        uVar12 = uVar16;
      } while (bVar8);
    }
    uVar12 = (ulong)((int)local_38 + 1);
  }
  VectorBase<double>::operator=(&local_70->vec,&local_b8);
  this_00->state = PVEC;
  SPxVectorST<double>::setupWeights(this_00,local_78);
  if (local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSumST<R>::setupWeights(SPxSolverBase<R>& base)
{
   int count;
   int i;
   R x;
   VectorBase<R> work, delta, rowLen;

   assert(base.nRows() > 0);
   assert(base.nCols() > 0);

   rowLen.reDim(base.nRows(), true);
   work.reDim(base.nCols(), true);
   delta.reDim(base.nCols(), true);

   R* wrk = work.get_ptr();
   const R* lhs = base.lhs().get_const_ptr();
   const R* rhs = base.rhs().get_const_ptr();
   const R* up = base.upper().get_const_ptr();
   const R* low = base.lower().get_const_ptr();

   for(i = base.nRows(); --i >= 0;)
   {
      rowLen[i] = base.rowVector(i).length2();

      if(lhs[i] > 0)
         delta.multAdd(lhs[i] / rowLen[i], base.rowVector(i));
      else if(rhs[i] < 0)
         delta.multAdd(rhs[i] / rowLen[i], base.rowVector(i));
   }

   for(count = 0;; count++)
   {
      work += delta;

      for(i = base.nCols(); --i >= 0;)
      {
         if(wrk[i] > up[i])
            wrk[i] = up[i];

         if(wrk[i] < low[i])
            wrk[i] = low[i];
      }

      //      std::cout << -(work * base.maxObj()) << std::endl;
      if(count >= 12)
         break;

      delta.clear();

      for(i = base.nRows(); --i >= 0;)
      {
         x = base.rowVector(i) * work;

         if(lhs[i] > x)
            delta.multAdd((lhs[i] - x) / rowLen[i], base.rowVector(i));
         else if(rhs[i] < x)
            delta.multAdd((rhs[i] - x) / rowLen[i], base.rowVector(i));
      }
   }

   this->primal(work);
   SPxVectorST<R>::setupWeights(base);
}